

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

size_t __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>::
encode_scan(jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::encoder_strategy>
            *this,unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>
                  *process_line,byte_span destination)

{
  std::__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>::operator=
            ((__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_> *)
             &(this->super_encoder_strategy).process_line_,
             (__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_> *)
             process_line);
  (this->super_encoder_strategy).bit_buffer_ = 0;
  (this->super_encoder_strategy).free_bit_count_ = 0x20;
  (this->super_encoder_strategy).position_ = destination.data;
  (this->super_encoder_strategy).compressed_length_ = destination.size;
  encode_lines(this);
  return (this->super_encoder_strategy).bytes_written_ -
         ((long)(this->super_encoder_strategy).free_bit_count_ - 0x20U >> 3);
}

Assistant:

size_t encode_scan(std::unique_ptr<process_line> process_line, byte_span destination)
    {
        Strategy::process_line_ = std::move(process_line);

        Strategy::initialize(destination);
        encode_lines();

        return Strategy::get_length();
    }